

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O1

void * mi_new_nothrow(size_t size)

{
  long lVar1;
  undefined8 *puVar2;
  void *pvVar3;
  undefined1 in_SIL;
  size_t sVar4;
  long in_FS_OFFSET;
  
  if (size < 0x401) {
    lVar1 = *(long *)((long)(*(mi_heap_t **)(in_FS_OFFSET + -0x60))->pages_free_direct +
                     (size + 7 & 0xfffffffffffffff8));
    puVar2 = *(undefined8 **)(lVar1 + 0x10);
    if (puVar2 != (undefined8 *)0x0) {
      *(undefined8 *)(lVar1 + 0x10) = *puVar2;
      *(short *)(lVar1 + 0x20) = *(short *)(lVar1 + 0x20) + 1;
      goto LAB_004eeb97;
    }
  }
  sVar4 = size;
  puVar2 = (undefined8 *)_mi_malloc_generic(*(mi_heap_t **)(in_FS_OFFSET + -0x60),size,false,0);
  in_SIL = (undefined1)sVar4;
LAB_004eeb97:
  if (puVar2 != (undefined8 *)0x0) {
    return puVar2;
  }
  pvVar3 = mi_try_new(size,(_Bool)in_SIL);
  return pvVar3;
}

Assistant:

void* mi_new_nothrow(size_t size) mi_attr_noexcept {
  void* p = mi_malloc(size);
  if mi_unlikely(p == NULL) return mi_try_new(size, true);
  return p;
}